

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field.h
# Opt level: O2

Element_conflict
Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::_multiply
          (Element_conflict element,Element_conflict v)

{
  Element_conflict EVar1;
  uint uVar3;
  Element_conflict EVar2;
  
  EVar1 = 0;
  while (element != 0) {
    if ((element & 1) != 0) {
      EVar2 = EVar1 - 2;
      if (v < 2 - EVar1) {
        EVar2 = EVar1;
      }
      EVar1 = EVar2 + v;
    }
    element = element >> 1;
    uVar3 = v - 2;
    if (v < 2 - v) {
      uVar3 = v;
    }
    v = uVar3 + v;
  }
  return EVar1;
}

Assistant:

static Element _multiply(Element element, Element v) {
    Element a = element;
    element = 0;
    Element temp_b;

    while (a != 0) {
      if (a & 1) {
        if (v >= characteristic - element) element -= characteristic;
        element += v;
      }
      a >>= 1;

      temp_b = v;
      if (v >= characteristic - v) temp_b -= characteristic;
      v += temp_b;
    }

    return element;
  }